

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O1

Instr * __thiscall LowererMD::LowerAsmJsCallE(LowererMD *this,Instr *callInstr)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  Instr *pIVar2;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015c1bd0,AsmjsCallDebugBreakPhase,sourceContextId,functionId);
  if (bVar1) {
    GenerateDebugBreak(callInstr->m_next);
  }
  pIVar2 = LowererMDArch::LowerAsmJsCallE(&this->lowererMDArch,callInstr);
  return pIVar2;
}

Assistant:

IR::Instr *
LowererMD::LowerAsmJsCallE(IR::Instr * callInstr)
{
#if DBG
    if (PHASE_ON(Js::AsmjsCallDebugBreakPhase, this->m_func))
    {
        this->GenerateDebugBreak(callInstr->m_next);
    }
#endif
    return this->lowererMDArch.LowerAsmJsCallE(callInstr);
}